

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

iterator __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
::begin(raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
        *this)

{
  iterator iVar1;
  iterator local_18;
  
  local_18.ctrl_ = this->ctrl_;
  local_18.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)this->slots_;
  iterator::skip_empty_or_deleted(&local_18);
  iVar1.field_1.slot_ = local_18.field_1.slot_;
  iVar1.ctrl_ = local_18.ctrl_;
  return iVar1;
}

Assistant:

iterator iterator_at(size_t i) { return {ctrl_ + i, slots_ + i}; }